

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelfSelectClient.cpp
# Opt level: O1

void __thiscall xmrig::SelfSelectClient::setState(SelfSelectClient *this,State state)

{
  long lVar1;
  
  if (this->m_state != state) {
    if (state == RetryState) {
      lVar1 = std::chrono::_V2::steady_clock::now();
      this->m_timestamp = lVar1 / 1000000;
      if ((long)this->m_retries < this->m_failures) {
        (*this->m_listener->_vptr_IClientListener[2])(this->m_listener,this);
      }
      this->m_failures = this->m_failures + 1;
    }
    else if (state == WaitState) {
      lVar1 = std::chrono::_V2::steady_clock::now();
      this->m_timestamp = lVar1 / 1000000;
    }
    else if (state == IdleState) {
      this->m_timestamp = 0;
      this->m_failures = 0;
    }
    this->m_state = state;
  }
  return;
}

Assistant:

void xmrig::SelfSelectClient::setState(State state)
{
    if (m_state == state) {
        return;
    }

    switch (state) {
    case IdleState:
        m_timestamp = 0;
        m_failures  = 0;
        break;

    case WaitState:
        m_timestamp = Chrono::steadyMSecs();
        break;

    case RetryState:
        m_timestamp = Chrono::steadyMSecs();

        if (m_failures > m_retries) {
            m_listener->onClose(this, static_cast<int>(m_failures));
        }

        m_failures++;
        break;
    }

    m_state = state;
}